

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

double array_max(double *array,int N)

{
  double dVar1;
  long lVar2;
  double dVar3;
  
  dVar3 = *array;
  for (lVar2 = 1; lVar2 < N; lVar2 = lVar2 + 1) {
    dVar1 = array[lVar2];
    if (array[lVar2] <= dVar3) {
      dVar1 = dVar3;
    }
    dVar3 = dVar1;
  }
  return dVar3;
}

Assistant:

double array_max(double *array,int N) {
	int i;
	double m = array[0];

	for (i = 1; i < N;++i) {
		if (array[i] > m ) {
			m = array[i];
		}
	}

	return m;
}